

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int pkey_gost_mac_signctx(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,EVP_MD_CTX *mctx)

{
  int iVar1;
  void *pvVar2;
  EVP_MD *pEVar3;
  code *pcVar4;
  uint tmpsiglen;
  uint local_2c;
  
  pvVar2 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if (siglen == (size_t *)0x0) {
    iVar1 = 0;
  }
  else {
    local_2c = (uint)*siglen;
    if (sig == (uchar *)0x0) {
      iVar1 = 1;
    }
    else {
      pEVar3 = EVP_MD_CTX_md((EVP_MD_CTX *)mctx);
      pcVar4 = (code *)EVP_MD_meth_get_ctrl(pEVar3);
      (*pcVar4)(mctx,3,(int)*(short *)((long)pvVar2 + 2),0);
      iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)mctx,sig,&local_2c);
    }
    *siglen = (long)*(short *)((long)pvVar2 + 2);
  }
  return iVar1;
}

Assistant:

static int pkey_gost_mac_signctx(EVP_PKEY_CTX *ctx, unsigned char *sig,
                                 size_t *siglen, EVP_MD_CTX *mctx)
{
    unsigned int tmpsiglen;
    int ret;
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);

    if (!siglen)
        return 0;
    tmpsiglen = *siglen;        /* for platforms where sizeof(int) !=
                                 * sizeof(size_t) */

    if (!sig) {
        *siglen = data->mac_size;
        return 1;
    }

    EVP_MD_meth_get_ctrl(EVP_MD_CTX_md(mctx))
        (mctx, EVP_MD_CTRL_XOF_LEN, data->mac_size, NULL);
    ret = EVP_DigestFinal_ex(mctx, sig, &tmpsiglen);
    *siglen = data->mac_size;
    return ret;
}